

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O1

char * libj1939_addr2str(sockaddr_can *can)

{
  int iVar1;
  char *pcVar2;
  
  if (can->can_ifindex == 0) {
    pcVar2 = libj1939_addr2str::buf;
  }
  else {
    pcVar2 = libj1939_ifnam(can->can_ifindex);
    if (pcVar2 == (char *)0x0) {
      iVar1 = sprintf(libj1939_addr2str::buf,"#%i:",(ulong)(uint)can->can_ifindex);
    }
    else {
      iVar1 = sprintf(libj1939_addr2str::buf,"%s:",pcVar2);
    }
    pcVar2 = libj1939_addr2str::buf + iVar1;
  }
  if ((can->can_addr).j1939.name == 0) {
    if ((can->can_addr).j1939.addr == 0xff) {
      pcVar2[0] = '-';
      pcVar2[1] = '\0';
      pcVar2 = pcVar2 + 1;
    }
    else {
      iVar1 = sprintf(pcVar2,"%02x");
      pcVar2 = pcVar2 + iVar1;
    }
  }
  else {
    iVar1 = sprintf(pcVar2,"%016llx");
    pcVar2 = pcVar2 + iVar1;
    if ((can->can_addr).j1939.pgn == 0xee00) {
      iVar1 = sprintf(pcVar2,".%02x",(ulong)(can->can_addr).j1939.addr);
      pcVar2 = pcVar2 + iVar1;
    }
  }
  if ((can->can_addr).j1939.pgn < 0x40000) {
    sprintf(pcVar2,",%05x");
  }
  return libj1939_addr2str::buf;
}

Assistant:

const char *libj1939_addr2str(const struct sockaddr_can *can)
{
	char *str;
	static char buf[128];

	str = buf;
	if (can->can_ifindex) {
		const char *ifname;
		ifname = libj1939_ifnam(can->can_ifindex);
		if (!ifname)
			str += sprintf(str, "#%i:", can->can_ifindex);
		else
			str += sprintf(str, "%s:", ifname);
	}
	if (can->can_addr.j1939.name) {
		str += sprintf(str, "%016llx", (unsigned long long)can->can_addr.j1939.name);
		if (can->can_addr.j1939.pgn == J1939_PGN_ADDRESS_CLAIMED)
			str += sprintf(str, ".%02x", can->can_addr.j1939.addr);
	} else if (can->can_addr.j1939.addr <= 0xfe)
		str += sprintf(str, "%02x", can->can_addr.j1939.addr);
	else
		str += sprintf(str, "-");
	if (can->can_addr.j1939.pgn <= J1939_PGN_MAX)
		str += sprintf(str, ",%05x", can->can_addr.j1939.pgn);

	return buf;
}